

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::resize(Buffer *this,off_t minSize)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  size_t __n;
  ulong uVar5;
  char *newBuffer;
  off_t minSize_local;
  Buffer *this_local;
  
  if (this->capacity_ <= minSize) {
    uVar5 = minSize;
    if (minSize < 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pcVar4 = (char *)operator_new__(uVar5);
    lVar1 = this->leftIndex_;
    pcVar2 = this->buffer_;
    lVar3 = this->leftIndex_;
    __n = size(this);
    memcpy(pcVar4 + lVar1,pcVar2 + lVar3,__n);
    if (this->buffer_ != (char *)0x0) {
      operator_delete__(this->buffer_);
    }
    this->buffer_ = pcVar4;
    this->capacity_ = minSize;
  }
  return;
}

Assistant:

void Buffer::resize(off_t minSize) {
    if (minSize < capacity_)
        return;
    char *newBuffer = new char[minSize];
    ::memcpy(newBuffer + leftIndex_, buffer_ + leftIndex_, size());
    delete[] buffer_;
    buffer_ = newBuffer;
    capacity_ = minSize;
}